

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupRepresentationParser.cpp
# Opt level: O0

vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
* van_kampen::GroupRepresentationParser::parse
            (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             *__return_storage_ptr__,string *text)

{
  bool bVar1;
  difference_type dVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  invalid_argument *this;
  reference pbVar3;
  difference_type __n;
  char *pcVar4;
  long lVar5;
  long lVar6;
  bool local_331;
  GroupElement local_2e8;
  byte local_2b9;
  undefined1 local_2b8 [7];
  bool reversed;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  undefined1 local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  powChar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c;
  iterator __end2;
  iterator __begin2;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> curWord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  iterator __end1;
  iterator __begin1;
  string local_190;
  allocator<char> local_169;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  char *local_100;
  char *local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  wordsEnd;
  string local_d8 [32];
  char *local_b8;
  char *local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  wordsBegin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  alphabetEnd;
  allocator<char> local_59;
  string local_58 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  alphabetBegin;
  anon_class_1_0_00000001 withoutBorders;
  string *text_local;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *words;
  
  local_38._M_current = (char *)std::__cxx11::string::begin();
  dVar2 = std::__cxx11::string::find((char *)text,0x21e3ca);
  local_30 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_38,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"FreeGroup( ",&local_59);
  dVar2 = std::__cxx11::string::length();
  local_28 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_30,dVar2);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_80._M_current = (char *)std::__cxx11::string::begin();
  __first._M_current = (char *)std::__cxx11::string::begin();
  wordsBegin._M_current = local_28._M_current;
  std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__first,local_28);
  dVar2 = std::__cxx11::string::find((char *)text,0x21e3d6);
  local_78 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_80,dVar2);
  local_a8._M_current = (char *)std::__cxx11::string::begin();
  local_b0 = (char *)std::__cxx11::string::begin();
  local_b8 = local_78._M_current;
  std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_b0,local_78);
  dVar2 = std::__cxx11::string::find((char *)text,0x21e3da);
  local_a0 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_a8,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"[ ",(allocator<char> *)((long)&wordsEnd._M_current + 7));
  dVar2 = std::__cxx11::string::length();
  local_98 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_a0,dVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&wordsEnd._M_current + 7));
  local_f0._M_current = (char *)std::__cxx11::string::begin();
  local_f8 = (char *)std::__cxx11::string::begin();
  local_100 = local_98._M_current;
  std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_f8,local_98);
  dVar2 = std::__cxx11::string::find((char *)text,0x21e3dd);
  local_e8 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_f0,dVar2);
  local_108._M_current = (char *)std::__cxx11::string::begin();
  bVar1 = __gnu_cxx::operator<=(&local_108,&local_e8);
  local_331 = false;
  if (bVar1) {
    local_110._M_current = (char *)std::__cxx11::string::end();
    local_331 = __gnu_cxx::operator<=(&local_e8,&local_110);
  }
  if (((local_331 ^ 0xffU) & 1) == 0) {
    __range1._7_1_ = 0;
    std::
    vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
    ::vector(__return_storage_ptr__);
    local_160._M_current = local_98._M_current;
    local_168._M_current = local_e8._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&local_158,local_160,local_168,&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,", ",(allocator<char> *)((long)&__begin1._M_current + 7));
    split_by_delim(&local_138,&local_158,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1._M_current + 7));
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_169);
    local_120 = &local_138;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_120);
    local_1a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_120);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_1a8), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string
                ((string *)
                 &curWord.
                  super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pbVar3);
      std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
                ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                 &__range2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"*",(allocator<char> *)((long)&__begin2._M_current + 7));
      split_by_delim(&local_208,
                     (string *)
                     &curWord.
                      super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__begin2._M_current + 7));
      local_1f0 = &local_208;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_1f0);
      c.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_1f0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&c.field_2 + 8)), bVar1) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        std::__cxx11::string::string((string *)&powChar,(string *)pbVar3);
        __n = std::__cxx11::string::find((char)&powChar,0x5e);
        element.field_2._8_8_ = std::__cxx11::string::begin();
        local_268 = __gnu_cxx::operator+
                              (__n,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)((long)&element.field_2 + 8));
        local_298._M_current = (char *)std::__cxx11::string::begin();
        __gnu_cxx::operator-(&local_268,&local_298);
        std::__cxx11::string::substr((ulong)local_290,(ulong)&powChar);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_290);
        if (*pcVar4 == '(') {
          parse(std::__cxx11::string_const&)::$_0::operator()::string_const___const
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     (void *)((long)&alphabetBegin._M_current + 7),(string *)local_290);
          std::__cxx11::string::operator=((string *)local_290,(string *)local_2b8);
          std::__cxx11::string::~string((string *)local_2b8);
        }
        lVar5 = std::__cxx11::string::size();
        lVar6 = std::__cxx11::string::size();
        local_2b9 = lVar5 != lVar6;
        std::__cxx11::string::string((string *)&local_2e8,(string *)local_290);
        local_2e8.reversed = (bool)(local_2b9 & 1);
        std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::
        emplace_back<van_kampen::GroupElement>
                  ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                   &__range2,&local_2e8);
        GroupElement::~GroupElement(&local_2e8);
        std::__cxx11::string::~string((string *)local_290);
        std::__cxx11::string::~string((string *)&powChar);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      std::
      vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
      ::emplace_back<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>
                ((vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
                  *)__return_storage_ptr__,
                 (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                 &__range2);
      std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
                ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                 &__range2);
      std::__cxx11::string::~string
                ((string *)
                 &curWord.
                  super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid group representation format");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<std::vector<GroupElement>> GroupRepresentationParser::parse(const std::string &text)
{
    auto withoutBorders = [](const std::string &s) {
        if (s.length() < 2)
        {
            throw std::invalid_argument("can not parse pattern '" + s + "'");
        }
        return s.substr(1, s.length() - 2);
    };

    auto alphabetBegin = text.begin() + text.find("FreeGroup( ") + std::string("FreeGroup( ").length();
    auto alphabetEnd = text.begin() + text.find(" );", std::distance(text.begin(), alphabetBegin));

    auto wordsBegin = text.begin() + text.find("[ ", std::distance(text.begin(), alphabetEnd)) + std::string("[ ").length();
    auto wordsEnd = text.begin() + text.find(" ]", std::distance(text.begin(), wordsBegin));

    if (!(text.begin() <= wordsEnd && wordsEnd <= text.end()))
    {
        throw std::invalid_argument("invalid group representation format");
    }

    std::vector<std::vector<van_kampen::GroupElement>> words;

    for (auto word : van_kampen::split_by_delim({wordsBegin, wordsEnd}, ", "))
    {
        std::vector<van_kampen::GroupElement> curWord;
        for (auto c : van_kampen::split_by_delim(word, "*"))
        {
            auto powChar = c.find('^') + c.begin();
            auto element = c.substr(0, powChar - c.begin());
            if (element[0] == '(')
            {
                element = withoutBorders(element);
            }
            bool reversed = element.size() != c.size();
            curWord.emplace_back(GroupElement{std::move(element), reversed});
        }
        words.emplace_back(std::move(curWord));
    }

    return words;
}